

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

void __thiscall cppcms::http::response::content_md5(response *this,string *s)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Content-MD5",&local_39);
  set_header(this,&local_38,s);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void response::content_md5(std::string const &s) { set_header("Content-MD5",s); }